

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space.cpp
# Opt level: O0

void hide_ship_command_proc(Am_Object *command_obj)

{
  byte bVar1;
  Am_Value *pAVar2;
  Am_Object local_30 [3];
  Am_Object local_18;
  Am_Object new_object;
  Am_Object *command_obj_local;
  
  new_object.data = (Am_Object_Data *)command_obj;
  pAVar2 = (Am_Value *)Am_Object::Get((ushort)command_obj,0x169);
  Am_Object::Am_Object(&local_18,pAVar2);
  bVar1 = Am_Object::Valid();
  if ((bVar1 & 1) != 0) {
    Am_Object::Am_Object(local_30,(Am_Object *)&local_18);
    hide_ship(local_30);
    Am_Object::~Am_Object(local_30);
  }
  Am_Object::~Am_Object(&local_18);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, hide_ship_command,
                 (Am_Object command_obj))
{
  Am_Object new_object = command_obj.Get(Am_VALUE);
  if (new_object.Valid())
    hide_ship(new_object);
}